

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O1

Status google::protobuf::anon_unknown_21::FillDefaults
                 (Edition edition,Message *fixed,Message *overridable)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  uint uVar3;
  FieldOptions *pFVar4;
  char *pcVar5;
  pointer pFVar6;
  bool bVar7;
  FieldOptions_FeatureSupport *p;
  Descriptor *pDVar8;
  undefined1 *puVar9;
  Rep *pRVar10;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *this;
  ulong uVar11;
  Nonnull<const_char_*> failure_msg;
  FieldDescriptor *in_RCX;
  pointer pFVar12;
  long lVar13;
  Edition edition_00;
  FieldDescriptor *pFVar14;
  __normal_iterator<google::protobuf::FieldOptions_EditionDefault_*,_std::vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>_>
  __i;
  long lVar15;
  pointer pFVar16;
  undefined4 in_register_0000003c;
  ulong uVar17;
  ulong uVar18;
  AlphaNum *in_R8;
  AlphaNum *in_R9;
  FieldDescriptor *field;
  RepeatedPtrIterator<const_google::protobuf::FieldOptions_EditionDefault> __first;
  size_t *psVar19;
  Metadata MVar20;
  string_view input;
  string_view message;
  string_view message_00;
  vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
  defaults;
  EditionDefault edition_lookup;
  string local_1b8;
  FieldDescriptor *local_198;
  FieldDescriptor *local_190;
  Descriptor *local_188;
  long *local_180;
  ulong local_178;
  long local_170 [2];
  vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
  local_160;
  LogMessage local_148 [3];
  StringifySink local_118;
  long local_f0;
  FieldOptions_EditionDefault local_e8;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  message._M_len = (undefined8 *)CONCAT44(in_register_0000003c,edition);
  local_190 = (FieldDescriptor *)overridable;
  MVar20 = Message::GetMetadata(overridable);
  pDVar8 = MVar20.descriptor;
  local_198 = in_RCX;
  MVar20 = Message::GetMetadata((Message *)in_RCX);
  if (pDVar8 != MVar20.descriptor) {
    _GLOBAL__N_1::FillDefaults((_GLOBAL__N_1 *)local_148);
LAB_00417608:
    internal::protobuf_assumption_failed
              ("!value || _impl_.feature_support_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x49b9);
  }
  FieldOptions_EditionDefault::FieldOptions_EditionDefault(&local_e8,(Arena *)0x0);
  edition_00 = (Edition)fixed;
  bVar7 = internal::ValidateEnum(edition_00,(uint32_t *)Edition_internal_data_);
  if (!bVar7) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::Edition_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                  ,0x46f6,
                  "void google::protobuf::FieldOptions_EditionDefault::_internal_set_edition(::google::protobuf::Edition)"
                 );
  }
  local_e8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_e8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  local_e8.field_0._impl_.edition_ = edition_00;
  if (0 < pDVar8->field_count_) {
    lVar13 = 0;
    local_188 = pDVar8;
    do {
      pFVar14 = pDVar8->fields_;
      pFVar4 = pFVar14[lVar13].options_;
      uVar3 = (pFVar4->field_0)._impl_._has_bits_.has_bits_[0];
      puVar9 = (undefined1 *)(pFVar4->field_0)._impl_.feature_support_;
      local_f0 = lVar13;
      if (((FieldOptions_FeatureSupport *)puVar9 == (FieldOptions_FeatureSupport *)0x0 &
          (byte)uVar3 >> 1) == 1) goto LAB_00417608;
      field = local_198;
      if ((uVar3 & 2) != 0) {
        if ((FieldOptions_FeatureSupport *)puVar9 == (FieldOptions_FeatureSupport *)0x0) {
          puVar9 = _FieldOptions_FeatureSupport_default_instance_;
        }
        if ((((((undefined1  [32])((FieldOptions_FeatureSupport *)puVar9)->field_0 &
               (undefined1  [32])0x2) == (undefined1  [32])0x0) ||
             (field = local_190,
             (((FieldOptions_FeatureSupport *)puVar9)->field_0)._impl_.edition_introduced_ <=
             (int)edition_00)) &&
            (field = local_198,
            ((undefined1  [32])((FieldOptions_FeatureSupport *)puVar9)->field_0 &
            (undefined1  [32])0x8) != (undefined1  [32])0x0)) &&
           ((((FieldOptions_FeatureSupport *)puVar9)->field_0)._impl_.edition_removed_ <=
            (int)edition_00)) {
          field = local_190;
        }
      }
      MVar20 = Message::GetMetadata((Message *)field);
      pFVar14 = pFVar14 + lVar13;
      Reflection::ClearField(MVar20.reflection,(Message *)field,pFVar14);
      bVar2 = pFVar14->field_0x1;
      bVar7 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar7) {
        failure_msg = (Nonnull<const_char_*>)0x0;
      }
      else {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar7,0xbf < bVar2,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (failure_msg != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_148,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,failure_msg);
LAB_004175ee:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_148);
      }
      if ((pFVar14->field_0x1 & 0x20) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_148,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver.cc"
                   ,0x136,"!field.is_repeated()");
        goto LAB_004175ee;
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar14->type_ * 4) == 10) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_148,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver.cc"
                   ,0x137,"field.cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE");
        goto LAB_004175ee;
      }
      __first.it_ = (void **)&(pFVar14->options_->field_0)._impl_.edition_defaults_;
      if ((*(byte *)((long)&pFVar14->options_->field_0 + 0x30) & 1) != 0) {
        pRVar10 = internal::RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)__first.it_);
        __first.it_ = pRVar10->elements;
      }
      pFVar4 = pFVar14->options_;
      this = &(pFVar4->field_0)._impl_.edition_defaults_;
      if ((*(byte *)((long)&pFVar4->field_0 + 0x30) & 1) != 0) {
        pRVar10 = internal::RepeatedPtrFieldBase::rep(&this->super_RepeatedPtrFieldBase);
        this = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)pRVar10->elements;
      }
      std::
      vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>
      ::
      vector<google::protobuf::internal::RepeatedPtrIterator<google::protobuf::FieldOptions_EditionDefault_const>,void>
                ((vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>
                  *)&local_160,__first,
                 (RepeatedPtrIterator<const_google::protobuf::FieldOptions_EditionDefault>)
                 (&(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                 *(int *)((long)&pFVar4->field_0 + 0x38)),(allocator_type *)local_148);
      pFVar6 = local_160.
               super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pFVar12 = local_160.
                super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_160.
          super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_160.
          super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar15 = (long)local_160.
                       super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_160.
                       super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = (lVar15 >> 3) * -0x3333333333333333;
        lVar13 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar13 == 0; lVar13 = lVar13 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldOptions_EditionDefault*,std::vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FillDefaults(google::protobuf::Edition,google::protobuf::Message&,google::protobuf::Message&)::__0>>
                  (local_160.
                   super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_160.
                   super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar15 < 0x281) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldOptions_EditionDefault*,std::vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FillDefaults(google::protobuf::Edition,google::protobuf::Message&,google::protobuf::Message&)::__0>>
                    (pFVar12,pFVar6);
        }
        else {
          pFVar16 = pFVar12 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldOptions_EditionDefault*,std::vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FillDefaults(google::protobuf::Edition,google::protobuf::Message&,google::protobuf::Message&)::__0>>
                    (pFVar12,pFVar16);
          for (; pFVar16 != pFVar6; pFVar16 = pFVar16 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldOptions_EditionDefault*,std::vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::(anonymous_namespace)::FillDefaults(google::protobuf::Edition,google::protobuf::Message&,google::protobuf::Message&)::__0>>
                      (pFVar16);
          }
        }
      }
      pFVar12 = local_160.
                super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (long)local_160.
                    super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_160.
                    super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        uVar11 = ((ulong)((long)local_160.
                                super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_160.
                               super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                 -0x3333333333333333;
        do {
          uVar17 = uVar11 >> 1;
          in_R8 = (AlphaNum *)(uVar17 * 5);
          uVar18 = uVar17;
          if (pFVar12[uVar17].field_0._impl_.edition_ <= local_e8.field_0._impl_.edition_) {
            uVar18 = ~uVar17 + uVar11;
            pFVar12 = pFVar12 + uVar17 + 1;
          }
          uVar11 = uVar18;
        } while (0 < (long)uVar18);
      }
      if (pFVar12 ==
          local_160.
          super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pcVar5 = (pFVar14->all_names_).payload_;
        uVar11 = (ulong)*(ushort *)(pcVar5 + 2);
        local_148[0].errno_saver_.saved_errno_ = 0x23;
        local_148[0]._4_4_ = 0;
        local_148[0].data_._M_t.
        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        ._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
              )(__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                )0x6e076c;
        paVar1 = &local_118.buffer_.field_2;
        local_118.buffer_.field_2._8_8_ = 0;
        local_118.buffer_._M_string_length = 0;
        local_118.buffer_.field_2._M_allocated_capacity = 0;
        local_118.buffer_._M_dataplus._M_p = (pointer)paVar1;
        AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_118,edition_00);
        local_c0.piece_._M_str = pcVar5 + ~uVar11;
        local_60.piece_._M_len = local_118.buffer_._M_string_length;
        local_60.piece_._M_str = local_118.buffer_._M_dataplus._M_p;
        local_90.piece_._M_len = 0x12;
        local_90.piece_._M_str = " in feature field ";
        local_c0.piece_._M_len = uVar11;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_1b8,(lts_20250127 *)local_148,&local_60,&local_90,&local_c0,in_R9);
        message_00._M_str = (char *)local_1b8._M_string_length;
        message_00._M_len = (size_t)message._M_len;
        absl::lts_20250127::FailedPreconditionError(message_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118.buffer_._M_dataplus._M_p != paVar1) {
          operator_delete(local_118.buffer_._M_dataplus._M_p,
                          local_118.buffer_.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
        ::~vector(&local_160);
        goto LAB_00417588;
      }
      psVar19 = (size_t *)
                ((ulong)pFVar12[-1].field_0._impl_.value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      input._M_str = (char *)pFVar14;
      input._M_len = *psVar19;
      bVar7 = TextFormat::ParseFieldValueFromString
                        ((TextFormat *)psVar19[1],input,field,(Message *)in_R8);
      if (bVar7) {
        std::
        vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
        ::~vector(&local_160);
        pDVar8 = local_188;
      }
      else {
        pcVar5 = (pFVar14->all_names_).payload_;
        uVar11 = (ulong)*(ushort *)(pcVar5 + 2);
        local_180 = local_170;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_180,*psVar19,psVar19[1] + *psVar19);
        local_60.piece_._M_str = pcVar5 + ~uVar11;
        local_148[0].errno_saver_.saved_errno_ = 0x34;
        local_148[0]._4_4_ = 0;
        local_148[0].data_._M_t.
        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        ._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
              )(__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                )0x6e4d93;
        local_90.piece_._M_len = 0x13;
        local_90.piece_._M_str = ". Could not parse: ";
        local_c0.piece_._M_len = local_178;
        local_c0.piece_._M_str = (char *)local_180;
        in_R8 = &local_c0;
        local_60.piece_._M_len = uVar11;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_1b8,(lts_20250127 *)local_148,&local_60,&local_90,in_R8,in_R9);
        message._M_str = (char *)local_1b8._M_string_length;
        absl::lts_20250127::FailedPreconditionError(message);
        pDVar8 = local_188;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if (local_180 != local_170) {
          operator_delete(local_180,local_170[0] + 1);
        }
        std::
        vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
        ::~vector(&local_160);
        if (!bVar7) goto LAB_00417588;
      }
      lVar13 = local_f0 + 1;
    } while (lVar13 < pDVar8->field_count_);
  }
  *message._M_len = 1;
LAB_00417588:
  FieldOptions_EditionDefault::~FieldOptions_EditionDefault(&local_e8);
  return (Status)(uintptr_t)message._M_len;
}

Assistant:

absl::Status FillDefaults(Edition edition, Message& fixed,
                          Message& overridable) {
  const Descriptor& descriptor = *fixed.GetDescriptor();
  ABSL_CHECK(&descriptor == overridable.GetDescriptor());

  auto comparator = [](const FieldOptions::EditionDefault& a,
                       const FieldOptions::EditionDefault& b) {
    return a.edition() < b.edition();
  };
  FieldOptions::EditionDefault edition_lookup;
  edition_lookup.set_edition(edition);

  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field = *descriptor.field(i);
    Message* msg = &overridable;
    if (field.options().has_feature_support()) {
      if ((field.options().feature_support().has_edition_introduced() &&
           edition < field.options().feature_support().edition_introduced()) ||
          (field.options().feature_support().has_edition_removed() &&
           edition >= field.options().feature_support().edition_removed())) {
        msg = &fixed;
      }
    }

    msg->GetReflection()->ClearField(msg, &field);
    ABSL_CHECK(!field.is_repeated());
    ABSL_CHECK(field.cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE);

    std::vector<FieldOptions::EditionDefault> defaults{
        field.options().edition_defaults().begin(),
        field.options().edition_defaults().end()};
    absl::c_sort(defaults, comparator);
    auto first_nonmatch =
        absl::c_upper_bound(defaults, edition_lookup, comparator);
    if (first_nonmatch == defaults.begin()) {
      return Error("No valid default found for edition ", edition,
                   " in feature field ", field.full_name());
    }

    const std::string& def = std::prev(first_nonmatch)->value();
    if (!TextFormat::ParseFieldValueFromString(def, &field, msg)) {
      return Error("Parsing error in edition_defaults for feature field ",
                   field.full_name(), ". Could not parse: ", def);
    }
  }

  return absl::OkStatus();
}